

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

ParamDict * __thiscall ncnn::ParamDict::operator=(ParamDict *this,ParamDict *rhs)

{
  int iVar1;
  ParamDictPrivate *pPVar2;
  ParamDictPrivate *pPVar3;
  int *piVar4;
  Allocator *pAVar5;
  Mat *pMVar6;
  Mat *pMVar7;
  ParamDict *in_RSI;
  ParamDict *in_RDI;
  int type;
  int i;
  int local_54;
  
  if (in_RDI != in_RSI) {
    for (local_54 = 0; local_54 < 0x20; local_54 = local_54 + 1) {
      iVar1 = in_RSI->d->params[local_54].type;
      in_RDI->d->params[local_54].type = iVar1;
      if (((iVar1 == 1) || (iVar1 == 2)) || (iVar1 == 3)) {
        in_RDI->d->params[local_54].field_1 = in_RSI->d->params[local_54].field_1;
      }
      else {
        pPVar2 = in_RSI->d;
        pMVar6 = &pPVar2->params[local_54].v;
        pPVar3 = in_RDI->d;
        pMVar7 = &pPVar3->params[local_54].v;
        if (pMVar7 != pMVar6) {
          if (pPVar2->params[local_54].v.refcount != (int *)0x0) {
            piVar4 = pPVar2->params[local_54].v.refcount;
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          if (pPVar3->params[local_54].v.refcount != (int *)0x0) {
            piVar4 = pPVar3->params[local_54].v.refcount;
            LOCK();
            iVar1 = *piVar4;
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (iVar1 == 1) {
              if (pPVar3->params[local_54].v.allocator == (Allocator *)0x0) {
                if (pMVar7->data != (void *)0x0) {
                  free(pMVar7->data);
                }
              }
              else {
                pAVar5 = pPVar3->params[local_54].v.allocator;
                (*pAVar5->_vptr_Allocator[3])(pAVar5,pMVar7->data);
              }
            }
          }
          pMVar7->data = (void *)0x0;
          pPVar3->params[local_54].v.elemsize = 0;
          pPVar3->params[local_54].v.elempack = 0;
          pPVar3->params[local_54].v.dims = 0;
          pPVar3->params[local_54].v.w = 0;
          pPVar3->params[local_54].v.h = 0;
          pPVar3->params[local_54].v.d = 0;
          pPVar3->params[local_54].v.c = 0;
          pPVar3->params[local_54].v.cstep = 0;
          pPVar3->params[local_54].v.refcount = (int *)0x0;
          pMVar7->data = pMVar6->data;
          pPVar3->params[local_54].v.refcount = pPVar2->params[local_54].v.refcount;
          pPVar3->params[local_54].v.elemsize = pPVar2->params[local_54].v.elemsize;
          pPVar3->params[local_54].v.elempack = pPVar2->params[local_54].v.elempack;
          pPVar3->params[local_54].v.allocator = pPVar2->params[local_54].v.allocator;
          pPVar3->params[local_54].v.dims = pPVar2->params[local_54].v.dims;
          pPVar3->params[local_54].v.w = pPVar2->params[local_54].v.w;
          pPVar3->params[local_54].v.h = pPVar2->params[local_54].v.h;
          pPVar3->params[local_54].v.d = pPVar2->params[local_54].v.d;
          pPVar3->params[local_54].v.c = pPVar2->params[local_54].v.c;
          pPVar3->params[local_54].v.cstep = pPVar2->params[local_54].v.cstep;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

ParamDict& ParamDict::operator=(const ParamDict& rhs)
{
    if (this == &rhs)
        return *this;

    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        int type = rhs.d->params[i].type;
        d->params[i].type = type;
        if (type == 1 || type == 2 || type == 3)
        {
            d->params[i].i = rhs.d->params[i].i;
        }
        else // if (type == 4 || type == 5 || type == 6)
        {
            d->params[i].v = rhs.d->params[i].v;
        }
    }

    return *this;
}